

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# efsw-test.cpp
# Opt level: O2

void __thiscall
UpdateListener::handleFileAction
          (UpdateListener *this,WatchID watchid,string *dir,string *filename,Action action,
          string *oldFilename)

{
  size_type sVar1;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Watch ID ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  poVar2 = std::operator<<(poVar2," DIR (");
  std::operator+(&local_b0,dir,") FILE (");
  sVar1 = oldFilename->_M_string_length;
  if (sVar1 == 0) {
    std::__cxx11::string::string((string *)&local_f0,"",(allocator *)&local_110);
  }
  else {
    std::operator+(&local_110,"from file ",oldFilename);
    std::operator+(&local_f0,&local_110," to ");
  }
  std::operator+(&local_90,&local_b0,&local_f0);
  std::operator+(&local_70,&local_90,filename);
  std::operator+(&local_50,&local_70,") has event ");
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  getActionName_abi_cxx11_(&local_d0,this,action);
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_f0);
  if (sVar1 != 0) {
    std::__cxx11::string::~string((string *)&local_110);
  }
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void handleFileAction( efsw::WatchID watchid, const std::string& dir,
						   const std::string& filename, efsw::Action action,
						   std::string oldFilename = "" ) override {
		std::cout << "Watch ID " << watchid << " DIR ("
				  << dir + ") FILE (" +
						 ( oldFilename.empty() ? "" : "from file " + oldFilename + " to " ) +
						 filename + ") has event "
				  << getActionName( action ) << std::endl;
	}